

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

void * XXH_alignedMalloc(size_t s,size_t align)

{
  long lVar1;
  long in_RSI;
  xxh_u8 *ptr;
  size_t offset;
  xxh_u8 *base;
  undefined8 local_8;
  
  local_8 = XXH_malloc(0x1283fd);
  if (local_8 == (void *)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    lVar1 = in_RSI - ((ulong)local_8 & in_RSI - 1U);
    local_8 = (void *)((long)local_8 + lVar1);
    *(char *)((long)local_8 + -1) = (char)lVar1;
  }
  return local_8;
}

Assistant:

static void* XXH_alignedMalloc(size_t s, size_t align) {
  XXH_ASSERT(align <= 128 && align >= 8); /* range check */
  XXH_ASSERT((align & (align - 1)) == 0); /* power of 2 */
  XXH_ASSERT(s != 0 && s < (s + align));  /* empty/overflow */
  { /* Overallocate to make room for manual realignment and an offset byte */
    xxh_u8* base = (xxh_u8*)XXH_malloc(s + align);
    if (base != NULL) {
      /*
       * Get the offset needed to align this pointer.
       *
       * Even if the returned pointer is aligned, there will always be
       * at least one byte to store the offset to the original pointer.
       */
      size_t offset = align - ((size_t)base & (align - 1)); /* base % align */
      /* Add the offset for the now-aligned pointer */
      xxh_u8* ptr = base + offset;

      XXH_ASSERT((size_t)ptr % align == 0);

      /* Store the offset immediately before the returned pointer. */
      ptr[-1] = (xxh_u8)offset;
      return ptr;
    }
    return NULL;
  }
}